

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::CanFunctionObjectHaveInlineCaches(FunctionBody *this)

{
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  if (((this->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None) {
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_00778738;
      *puVar6 = 0;
    }
    if ((FunctionBody *)
        (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) goto LAB_00778738;
      *puVar6 = 0;
    }
    if ((((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes &
        (Async|Generator)) == None) {
      uVar3 = GetCountField(this,InlineCacheCount);
      uVar4 = GetCountField(this,IsInstInlineCacheCount);
      sourceContextId =
           ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
      if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) {
LAB_00778738:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      bVar2 = Phases::IsEnabled((Phases *)&DAT_015b0240,ScriptFunctionWithInlineCachePhase,
                                sourceContextId,
                                ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
      if ((uVar4 + uVar3 != 0) && (bVar2)) {
        return true;
      }
      uVar7 = DAT_015b6008 + DAT_015b5ff4;
      if ((-1 < (int)uVar7) && (uVar5 = GetCountField(this,ByteCodeWithoutLDACount), uVar5 <= uVar7)
         ) {
        return (uVar4 + uVar3) - 1 < DAT_015bbe78 && -1 < (int)DAT_015bbe78;
      }
    }
  }
  return false;
}

Assistant:

bool FunctionBody::CanFunctionObjectHaveInlineCaches()
    {
        if (this->DoStackNestedFunc() || this->IsCoroutine())
        {
            return false;
        }

        uint totalCacheCount = this->GetInlineCacheCount() + this->GetIsInstInlineCacheCount();
        if (PHASE_FORCE(Js::ScriptFunctionWithInlineCachePhase, this) && totalCacheCount > 0)
        {
            return true;
        }

        // Only have inline caches on function object for possible inlining candidates.
        // Since we don't know the size of the top function, check against the maximum possible inline threshold
        // Negative inline byte code size threshold will disable inline cache on function object.
        const int byteCodeSizeThreshold = CONFIG_FLAG(InlineThreshold) + CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
        if (byteCodeSizeThreshold < 0 || this->GetByteCodeWithoutLDACount() > (uint)byteCodeSizeThreshold)
        {
            return false;
        }
        // Negative FuncObjectInlineCacheThreshold will disable inline cache on function object.
        if (CONFIG_FLAG(FuncObjectInlineCacheThreshold) < 0 || totalCacheCount > (uint)CONFIG_FLAG(FuncObjectInlineCacheThreshold) || totalCacheCount == 0)
        {
            return false;
        }

        return true;
    }